

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::dictCreate(dic *this)

{
  code *pcVar1;
  ulong uVar2;
  undefined1 local_a8 [8];
  dictht dct2;
  dictht dct1;
  dict dt;
  dic *this_local;
  
  dt.ht[1].used._0_4_ = 0xffffffff;
  dct1.table = (dictEntry **)0x80;
  dct1.size = 0x7f;
  dct1.sizemask = 0;
  uVar2 = SUB168(ZEXT816(0x80) * ZEXT816(8),0);
  if (SUB168(ZEXT816(0x80) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  dt._80_8_ = this;
  dct2.used = (unsigned_long)operator_new__(uVar2);
  dct2.table = (dictEntry **)0x0;
  dct2.size = 0xffffffffffffffff;
  dct2.sizemask = 0;
  dictht::operator=((dictht *)&dt.privdata,(dictht *)&dct2.used);
  dictht::operator=((dictht *)&dt.ht[0].used,(dictht *)local_a8);
  std::vector<dict,_std::allocator<dict>_>::push_back(&this->dc,(value_type *)&dct1.used);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int dic::dictCreate(){
    dict dt;
    dt.rehashidx=-1;
    dictht dct1,dct2;
    dct1.size=INITSIZE;
    dct1.sizemask=dct1.size-1;
    dct1.used=0;
    dct1.table=new dictEntry*[dct1.size];
    dct2.size=0;
    dct2.sizemask=-1;
    dct2.used=0;
    dt.ht[0]=dct1;
    dt.ht[1]=dct2;
    dc.push_back(dt);
    //return dc.end()-1-dc.begin();
}